

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

SequenceExprSyntax * __thiscall slang::parsing::Parser::parseSequencePrimary(Parser *this)

{
  Token closeParen_00;
  TokenKind TVar1;
  SequenceExprSyntax *pSVar2;
  EventExpressionSyntax *pEVar3;
  SequenceMatchListSyntax *matchList;
  FirstMatchSequenceExprSyntax *pFVar4;
  ExpressionSyntax *expr;
  SequenceRepetitionSyntax *repetition;
  SimpleSequenceExprSyntax *pSVar5;
  TimingControlSyntax *event;
  ClockingSequenceExprSyntax *pCVar6;
  Token TVar7;
  Token openParen;
  Token closeParen;
  
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  TVar1 = TVar7.kind;
  if (TVar1 == OpenParenthesis) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    pSVar2 = parseSequenceExpr(this,0,false);
    pSVar2 = parseParenthesizedSeqExpr(this,TVar7,pSVar2);
    return pSVar2;
  }
  if (TVar1 != PosEdgeKeyword) {
    if (TVar1 == At) {
      event = parseTimingControl(this,true);
      pSVar2 = parseSequenceExpr(this,0,false);
      pCVar6 = slang::syntax::SyntaxFactory::clockingSequenceExpr(&this->factory,event,pSVar2);
      return &pCVar6->super_SequenceExprSyntax;
    }
    if (TVar1 != EdgeKeyword) {
      if (TVar1 == FirstMatchKeyword) {
        TVar7 = ParserBase::consume(&this->super_ParserBase);
        openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
        pSVar2 = parseSequenceExpr(this,0,false);
        Token::Token(&closeParen);
        matchList = parseSequenceMatchList(this,&closeParen);
        closeParen_00.info = closeParen.info;
        closeParen_00.kind = closeParen.kind;
        closeParen_00._2_1_ = closeParen._2_1_;
        closeParen_00.numFlags.raw = closeParen.numFlags.raw;
        closeParen_00.rawLen = closeParen.rawLen;
        pFVar4 = slang::syntax::SyntaxFactory::firstMatchSequenceExpr
                           (&this->factory,TVar7,openParen,pSVar2,matchList,closeParen_00);
        return &pFVar4->super_SequenceExprSyntax;
      }
      if (TVar1 != NegEdgeKeyword) {
        if (TVar1 == DoubleHash) {
          pSVar2 = parseDelayedSequenceExpr(this,(SequenceExprSyntax *)0x0);
          return pSVar2;
        }
        expr = parseExpressionOrDist(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x10);
        repetition = parseSequenceRepetition(this);
        pSVar5 = slang::syntax::SyntaxFactory::simpleSequenceExpr(&this->factory,expr,repetition);
        return &pSVar5->super_SequenceExprSyntax;
      }
    }
  }
  pEVar3 = parseSignalEvent(this);
  return &pEVar3->super_SequenceExprSyntax;
}

Assistant:

SequenceExprSyntax& Parser::parseSequencePrimary() {
    auto current = peek();
    switch (current.kind) {
        case TokenKind::DoubleHash:
            return parseDelayedSequenceExpr(nullptr);
        case TokenKind::At: {
            auto event = parseTimingControl(/* inAssertion */ true);
            SLANG_ASSERT(event);
            return factory.clockingSequenceExpr(*event,
                                                parseSequenceExpr(0, /* isInProperty */ false));
        }
        case TokenKind::FirstMatchKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseSequenceExpr(0, /* isInProperty */ false);

            Token closeParen;
            auto matchList = parseSequenceMatchList(closeParen);
            return factory.firstMatchSequenceExpr(keyword, openParen, expr, matchList, closeParen);
        }
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& expr = parseSequenceExpr(0, /* isInProperty */ false);
            return parseParenthesizedSeqExpr(openParen, expr);
        }
        case TokenKind::EdgeKeyword:
        case TokenKind::NegEdgeKeyword:
        case TokenKind::PosEdgeKeyword:
            return parseSignalEvent();
        default: {
            auto& expr = parseExpressionOrDist(ExpressionOptions::SequenceExpr);
            auto repetition = parseSequenceRepetition();
            return factory.simpleSequenceExpr(expr, repetition);
        }
    }
}